

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int porterOpen(sqlite3_tokenizer *pTokenizer,char *zInput,int nInput,
              sqlite3_tokenizer_cursor **ppCursor)

{
  void *pvVar1;
  size_t sVar2;
  undefined8 *in_RCX;
  int in_EDX;
  char *in_RSI;
  porter_tokenizer_cursor *c;
  int in_stack_ffffffffffffffcc;
  undefined4 local_4;
  
  pvVar1 = sqlite3_malloc(in_stack_ffffffffffffffcc);
  if (pvVar1 == (void *)0x0) {
    local_4 = 7;
  }
  else {
    *(char **)((long)pvVar1 + 8) = in_RSI;
    if (in_RSI == (char *)0x0) {
      *(undefined4 *)((long)pvVar1 + 0x10) = 0;
    }
    else if (in_EDX < 0) {
      sVar2 = strlen(in_RSI);
      *(int *)((long)pvVar1 + 0x10) = (int)sVar2;
    }
    else {
      *(int *)((long)pvVar1 + 0x10) = in_EDX;
    }
    *(undefined4 *)((long)pvVar1 + 0x14) = 0;
    *(undefined4 *)((long)pvVar1 + 0x18) = 0;
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
    *(undefined4 *)((long)pvVar1 + 0x28) = 0;
    *in_RCX = pvVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int porterOpen(
  sqlite3_tokenizer *pTokenizer,         /* The tokenizer */
  const char *zInput, int nInput,        /* String to be tokenized */
  sqlite3_tokenizer_cursor **ppCursor    /* OUT: Tokenization cursor */
){
  porter_tokenizer_cursor *c;

  UNUSED_PARAMETER(pTokenizer);

  c = (porter_tokenizer_cursor *) sqlite3_malloc(sizeof(*c));
  if( c==NULL ) return SQLITE_NOMEM;

  c->zInput = zInput;
  if( zInput==0 ){
    c->nInput = 0;
  }else if( nInput<0 ){
    c->nInput = (int)strlen(zInput);
  }else{
    c->nInput = nInput;
  }
  c->iOffset = 0;                 /* start tokenizing at the beginning */
  c->iToken = 0;
  c->zToken = NULL;               /* no space allocated, yet. */
  c->nAllocated = 0;

  *ppCursor = &c->base;
  return SQLITE_OK;
}